

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O0

void __thiscall google::protobuf::internal::ArenaStringPtr::ClearToEmpty(ArenaStringPtr *this)

{
  bool bVar1;
  ScopedCheckPtrInvariants local_11;
  ArenaStringPtr *pAStack_10;
  ScopedCheckPtrInvariants check;
  ArenaStringPtr *this_local;
  
  pAStack_10 = this;
  anon_unknown_7::ScopedCheckPtrInvariants::ScopedCheckPtrInvariants(&local_11,&this->tagged_ptr_);
  bVar1 = IsDefault(this);
  if (!bVar1) {
    TaggedStringPtr::Get_abi_cxx11_(&this->tagged_ptr_);
    std::__cxx11::string::clear();
  }
  return;
}

Assistant:

void ArenaStringPtr::ClearToEmpty() {
  ScopedCheckPtrInvariants check(&tagged_ptr_);
  if (IsDefault()) {
    // Already set to default -- do nothing.
  } else {
    // Unconditionally mask away the tag.
    //
    // UpdateArenaString uses assign when capacity is larger than the new
    // value, which is trivially true in the donated string case.
    // const_cast<std::string*>(PtrValue<std::string>())->clear();
    tagged_ptr_.Get()->clear();
  }
}